

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::check_explicit_lod_allowed(CompilerGLSL *this,uint32_t lod)

{
  float fVar1;
  SPIREntryPoint *pSVar2;
  SPIRConstant *pSVar3;
  CompilerError *this_00;
  byte bVar4;
  allocator local_39;
  string local_38;
  
  pSVar2 = Compiler::get_entry_point(&this->super_Compiler);
  bVar4 = pSVar2->model == ExecutionModelFragment |
          (this->options).es ^ 1U | 299 < (this->options).version;
  if ((lod != 0) && (bVar4 == 0)) {
    pSVar3 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,lod);
    if ((pSVar3 == (SPIRConstant *)0x0) ||
       ((fVar1 = (pSVar3->m).c[0].r[0].f32, fVar1 != 0.0 || (NAN(fVar1))))) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Explicit lod not allowed in legacy ES non-fragment shaders.",
                 &local_39);
      CompilerError::CompilerError(this_00,&local_38);
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return (bool)bVar4;
}

Assistant:

bool CompilerGLSL::check_explicit_lod_allowed(uint32_t lod)
{
	auto &execution = get_entry_point();
	bool allowed = !is_legacy_es() || execution.model == ExecutionModelFragment;
	if (!allowed && lod != 0)
	{
		auto *lod_constant = maybe_get<SPIRConstant>(lod);
		if (!lod_constant || lod_constant->scalar_f32() != 0.0f)
		{
			SPIRV_CROSS_THROW("Explicit lod not allowed in legacy ES non-fragment shaders.");
		}
	}
	return allowed;
}